

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O3

Vector * Mul_QV(QMatrix *Q,Vector *V)

{
  double Dim;
  size_t *psVar1;
  ElType **ppEVar2;
  ElType **ppEVar3;
  Real *pRVar4;
  Real *pRVar5;
  double dVar6;
  LASErrIdType LVar7;
  Vector *V_00;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  double dVar14;
  ElType *pEVar15;
  Real *pRVar16;
  size_t sVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  Real RVar29;
  
  Q_Lock(Q);
  V_Lock(V);
  LVar7 = LASResult();
  if (LVar7 != LASOK) {
    V_00 = (Vector *)0x0;
    goto LAB_0010c0ec;
  }
  Dim = (double)Q->Dim;
  if (Dim != (double)V->Dim) {
    pcVar8 = Q_GetName(Q);
    pcVar11 = V_GetName(V);
    V_00 = (Vector *)0x0;
    LASError(LASDimErr,"Mul_QV",pcVar8,pcVar11,(char *)0x0);
    goto LAB_0010c0ec;
  }
  V_00 = (Vector *)malloc(0x30);
  pcVar8 = Q_GetName(Q);
  sVar9 = strlen(pcVar8);
  pcVar8 = V_GetName(V);
  sVar10 = strlen(pcVar8);
  pcVar8 = (char *)malloc(sVar9 + sVar10 + 10);
  pcVar11 = Q_GetName(Q);
  pcVar12 = V_GetName(V);
  if ((V_00 == (Vector *)0x0) || (pcVar8 == (char *)0x0)) {
    LASError(LASMemAllocErr,"Mul_QV",pcVar11,pcVar12,(char *)0x0);
    if (V_00 != (Vector *)0x0) {
      free(V_00);
    }
LAB_0010c0da:
    if (pcVar8 == (char *)0x0) goto LAB_0010c0ec;
  }
  else {
    sprintf(pcVar8,"(%s) * (%s)",pcVar11,pcVar12);
    V_Constr(V_00,pcVar8,(size_t)Dim,Tempor,True);
    Q_SortEl(Q);
    Q_AllocInvDiagEl(Q);
    LVar7 = LASResult();
    if ((LVar7 == LASOK) && (Q->ElSorted != (Boolean *)0x0)) {
      psVar1 = Q->Len;
      ppEVar2 = Q->El;
      ppEVar3 = Q->DiagEl;
      pRVar4 = V->Cmp;
      pRVar5 = V_00->Cmp;
      if ((Q->Symmetry != False) || (Q->ElOrder == Clmws)) {
        V_SetAllCmp(V_00,0.0);
      }
      dVar25 = V->Multipl;
      dVar19 = Q->MultiplD * dVar25;
      dVar21 = Q->MultiplU * dVar25;
      dVar25 = dVar25 * Q->MultiplL;
      dVar22 = ABS(dVar19);
      dVar20 = ABS(dVar19 + -1.0);
      if (((2.2250738585072014e-307 <= dVar22) &&
          (ABS(dVar21 / dVar19 + -1.0) < 2.220446049250313e-15)) &&
         (ABS(dVar25 / dVar19 + -1.0) < 2.220446049250313e-15)) {
        if (Q->Symmetry == False) {
          if (Q->ElOrder == Clmws) {
            if (Dim != 0.0) {
              dVar25 = 4.94065645841247e-324;
              do {
                sVar13 = psVar1[(long)dVar25];
                if (sVar13 != 0) {
                  dVar21 = pRVar4[(long)dVar25];
                  pRVar16 = &ppEVar2[(long)dVar25]->Val;
                  do {
                    pRVar5[((ElType *)(pRVar16 + -1))->Pos] =
                         *pRVar16 *
                         (double)(~-(ulong)(dVar20 < 2.220446049250313e-15) &
                                  (ulong)(dVar19 * dVar21) |
                                 (ulong)dVar21 & -(ulong)(dVar20 < 2.220446049250313e-15)) +
                         pRVar5[((ElType *)(pRVar16 + -1))->Pos];
                    pRVar16 = pRVar16 + 2;
                    sVar13 = sVar13 - 1;
                  } while (sVar13 != 0);
                }
                dVar25 = (double)((long)dVar25 + 1);
              } while ((ulong)dVar25 <= (ulong)Dim);
            }
          }
          else if (Q->ElOrder == Rowws) {
            if (Dim == 0.0) goto LAB_0010c0e2;
            dVar25 = 4.94065645841247e-324;
            do {
              sVar13 = psVar1[(long)dVar25];
              if (sVar13 == 0) {
                dVar21 = 0.0;
              }
              else {
                pRVar16 = &ppEVar2[(long)dVar25]->Val;
                dVar21 = 0.0;
                do {
                  dVar21 = dVar21 + *pRVar16 * pRVar4[((ElType *)(pRVar16 + -1))->Pos];
                  pRVar16 = pRVar16 + 2;
                  sVar13 = sVar13 - 1;
                } while (sVar13 != 0);
              }
              pRVar5[(long)dVar25] =
                   (Real)(~-(ulong)(dVar20 < 2.220446049250313e-15) & (ulong)(dVar19 * dVar21) |
                         (ulong)dVar21 & -(ulong)(dVar20 < 2.220446049250313e-15));
              dVar25 = (double)((long)dVar25 + 1);
            } while ((ulong)dVar25 <= (ulong)Dim);
          }
        }
        else {
          if (Dim == 0.0) goto LAB_0010c0e2;
          dVar25 = 4.94065645841247e-324;
          uVar18 = -(ulong)(dVar20 < 2.220446049250313e-15);
          do {
            sVar13 = psVar1[(long)dVar25];
            RVar29 = pRVar4[(long)dVar25];
            if (sVar13 == 0) {
              dVar20 = 0.0;
            }
            else {
              pRVar16 = &ppEVar2[(long)dVar25]->Val;
              dVar20 = 0.0;
              do {
                dVar21 = (double)((ElType *)(pRVar16 + -1))->Pos;
                if (dVar21 != dVar25) {
                  pRVar5[(long)dVar21] =
                       *pRVar16 *
                       (double)(~uVar18 & (ulong)(dVar19 * RVar29) | (ulong)RVar29 & uVar18) +
                       pRVar5[(long)dVar21];
                  dVar20 = dVar20 + *pRVar16 * pRVar4[(long)dVar21];
                }
                pRVar16 = pRVar16 + 2;
                sVar13 = sVar13 - 1;
              } while (sVar13 != 0);
              RVar29 = pRVar4[(long)dVar25];
            }
            dVar20 = RVar29 * ppEVar3[(long)dVar25]->Val + dVar20;
            pRVar5[(long)dVar25] =
                 (double)(~uVar18 & (ulong)(dVar19 * dVar20) | (ulong)dVar20 & uVar18) +
                 pRVar5[(long)dVar25];
            dVar25 = (double)((long)dVar25 + 1);
          } while ((ulong)dVar25 <= (ulong)Dim);
        }
        goto LAB_0010c0da;
      }
      dVar23 = ABS(dVar21);
      dVar24 = ABS(dVar25);
      dVar26 = ABS(dVar21 + -1.0);
      dVar28 = ABS(dVar25 + -1.0);
      if (Q->Symmetry == False) {
        if (Q->ElOrder == Rowws) {
          if (Dim != 0.0) {
            dVar14 = 4.94065645841247e-324;
            do {
              sVar13 = psVar1[(long)dVar14];
              RVar29 = 0.0;
              if (2.2250738585072014e-307 <= dVar24) {
                if (sVar13 != 0) {
                  pEVar15 = ppEVar2[(long)dVar14];
                  sVar17 = sVar13;
                  do {
                    if ((ulong)dVar14 <= pEVar15->Pos) break;
                    RVar29 = RVar29 + pEVar15->Val * pRVar4[pEVar15->Pos];
                    pEVar15 = pEVar15 + 1;
                    sVar17 = sVar17 - 1;
                  } while (sVar17 != 0);
                }
                if (2.220446049250313e-15 <= dVar28) {
                  RVar29 = RVar29 * dVar25;
                }
                RVar29 = RVar29 + 0.0;
              }
              if (2.2250738585072014e-307 <= dVar22) {
                RVar29 = RVar29 + (double)(~-(ulong)(dVar20 < 2.220446049250313e-15) &
                                           (ulong)(dVar19 * ppEVar3[(long)dVar14]->Val) |
                                          (ulong)ppEVar3[(long)dVar14]->Val &
                                          -(ulong)(dVar20 < 2.220446049250313e-15)) *
                                  pRVar4[(long)dVar14];
              }
              if (2.2250738585072014e-307 <= dVar23) {
                if (sVar13 == 0) {
                  dVar27 = 0.0;
                }
                else {
                  pRVar16 = &ppEVar2[(long)dVar14][sVar13 - 1].Val;
                  dVar27 = 0.0;
                  do {
                    if (((ElType *)(pRVar16 + -1))->Pos <= (ulong)dVar14) break;
                    dVar27 = dVar27 + *pRVar16 * pRVar4[((ElType *)(pRVar16 + -1))->Pos];
                    pRVar16 = pRVar16 + -2;
                    sVar13 = sVar13 - 1;
                  } while (sVar13 != 0);
                }
                if (2.220446049250313e-15 <= dVar26) {
                  dVar27 = dVar27 * dVar21;
                }
                RVar29 = RVar29 + dVar27;
              }
              pRVar5[(long)dVar14] = RVar29;
              dVar14 = (double)((long)dVar14 + 1);
            } while ((ulong)dVar14 <= (ulong)Dim);
            goto LAB_0010c0da;
          }
        }
        else if ((Q->ElOrder == Clmws) && (Dim != 0.0)) {
          dVar25 = 4.94065645841247e-324;
          do {
            sVar13 = psVar1[(long)dVar25];
            dVar28 = pRVar4[(long)dVar25];
            if ((2.2250738585072014e-307 <= dVar23) && (sVar13 != 0)) {
              pEVar15 = ppEVar2[(long)dVar25];
              sVar17 = sVar13;
              do {
                dVar14 = (double)pEVar15->Pos;
                if ((ulong)dVar25 <= (ulong)dVar14) break;
                pRVar5[(long)dVar14] =
                     pEVar15->Val *
                     (double)(~-(ulong)(dVar26 < 2.220446049250313e-15) & (ulong)(dVar21 * dVar28) |
                             -(ulong)(dVar26 < 2.220446049250313e-15) & (ulong)dVar28) +
                     pRVar5[(long)dVar14];
                pEVar15 = pEVar15 + 1;
                sVar17 = sVar17 - 1;
              } while (sVar17 != 0);
            }
            if (2.2250738585072014e-307 <= dVar22) {
              pRVar5[(long)dVar25] =
                   (double)(~-(ulong)(dVar20 < 2.220446049250313e-15) &
                            (ulong)(dVar19 * ppEVar3[(long)dVar25]->Val) |
                           (ulong)ppEVar3[(long)dVar25]->Val &
                           -(ulong)(dVar20 < 2.220446049250313e-15)) * dVar28 + pRVar5[(long)dVar25]
              ;
            }
            if (sVar13 != 0 && 2.2250738585072014e-307 <= dVar24) {
              pRVar16 = &ppEVar2[(long)dVar25][sVar13 - 1].Val;
              do {
                dVar14 = (double)((ElType *)(pRVar16 + -1))->Pos;
                if ((ulong)dVar14 <= (ulong)dVar25) break;
                pRVar5[(long)dVar14] = *pRVar16 * dVar28 + pRVar5[(long)dVar14];
                pRVar16 = pRVar16 + -2;
                sVar13 = sVar13 - 1;
              } while (sVar13 != 0);
            }
            dVar25 = (double)((long)dVar25 + 1);
          } while ((ulong)dVar25 <= (ulong)Dim);
          goto LAB_0010c0da;
        }
      }
      else if (Dim != 0.0) {
        dVar14 = 4.94065645841247e-324;
        do {
          sVar13 = psVar1[(long)dVar14];
          if (((2.2250738585072014e-307 <= dVar23) && (Q->ElOrder == Rowws)) ||
             ((dVar27 = 0.0, 2.2250738585072014e-307 <= dVar24 && (Q->ElOrder == Clmws)))) {
            if (sVar13 == 0) {
              dVar27 = 0.0;
            }
            else {
              pRVar16 = &ppEVar2[(long)dVar14]->Val;
              dVar27 = 0.0;
              sVar17 = sVar13;
              do {
                if ((double)((ElType *)(pRVar16 + -1))->Pos != dVar14) {
                  dVar27 = dVar27 + *pRVar16 * pRVar4[((ElType *)(pRVar16 + -1))->Pos];
                }
                pRVar16 = pRVar16 + 2;
                sVar17 = sVar17 - 1;
              } while (sVar17 != 0);
            }
            if (2.220446049250313e-15 <= dVar26 && 2.2250738585072014e-307 <= dVar23) {
              dVar27 = dVar27 * dVar21;
            }
            if (2.2250738585072014e-307 <= dVar24 && 2.220446049250313e-15 <= dVar28) {
              dVar27 = dVar27 * dVar25;
            }
          }
          if (2.2250738585072014e-307 <= dVar22) {
            dVar27 = dVar27 + (double)(~-(ulong)(dVar20 < 2.220446049250313e-15) &
                                       (ulong)(dVar19 * ppEVar3[(long)dVar14]->Val) |
                                      (ulong)ppEVar3[(long)dVar14]->Val &
                                      -(ulong)(dVar20 < 2.220446049250313e-15)) *
                              pRVar4[(long)dVar14];
          }
          pRVar5[(long)dVar14] = dVar27 + pRVar5[(long)dVar14];
          if (((2.2250738585072014e-307 <= dVar23) && (Q->ElOrder == Clmws)) ||
             ((2.2250738585072014e-307 <= dVar24 && (Q->ElOrder == Rowws)))) {
            dVar27 = pRVar4[(long)dVar14];
            if (2.220446049250313e-15 <= dVar26 && 2.2250738585072014e-307 <= dVar23) {
              dVar27 = dVar27 * dVar21;
            }
            if (2.2250738585072014e-307 <= dVar24 && 2.220446049250313e-15 <= dVar28) {
              dVar27 = dVar27 * dVar25;
            }
            if (sVar13 != 0) {
              pRVar16 = &ppEVar2[(long)dVar14]->Val;
              do {
                dVar6 = (double)((ElType *)(pRVar16 + -1))->Pos;
                if (dVar6 != dVar14) {
                  pRVar5[(long)dVar6] = *pRVar16 * dVar27 + pRVar5[(long)dVar6];
                }
                pRVar16 = pRVar16 + 2;
                sVar13 = sVar13 - 1;
              } while (sVar13 != 0);
            }
          }
          dVar14 = (double)((long)dVar14 + 1);
        } while ((ulong)dVar14 <= (ulong)Dim);
        goto LAB_0010c0da;
      }
    }
    else {
      LVar7 = LASResult();
      if ((LVar7 == LASOK) && (*Q->ElSorted == False)) {
        pcVar11 = Q_GetName(Q);
        pcVar12 = V_GetName(V);
        LASError(LASElNotSortedErr,"Mul_QV",pcVar11,pcVar12,(char *)0x0);
      }
    }
  }
LAB_0010c0e2:
  free(pcVar8);
LAB_0010c0ec:
  Q_Unlock(Q);
  V_Unlock(V);
  return V_00;
}

Assistant:

Vector *Mul_QV(QMatrix *Q, Vector *V)
/* VRes = Q * V */
{
    Vector *VRes;

    char *VResName;
    double MultiplDV, MultiplUV, MultiplLV;
    double Sum, PartSum, Cmp, PartCmp;
    size_t Dim, Row, Clm, RoC, Len, ElCount;
    size_t *QLen;
    Boolean MultiplDVIsZero, MultiplUVIsZero, MultiplLVIsZero;
    Boolean MultiplDVIsOne, MultiplUVIsOne, MultiplLVIsOne;
    Boolean MultiplDULVEquals;
    ElType **QEl, **QDiagEl, *PtrEl;
    Real *VCmp, *VResCmp;

    Q_Lock(Q);
    V_Lock(V);
    
    if (LASResult() == LASOK) {
        if (Q->Dim == V->Dim) {
            Dim = V->Dim;
            VRes = (Vector *)malloc(sizeof(Vector));
            VResName = (char *)malloc((strlen(Q_GetName(Q)) + strlen(V_GetName(V)) + 10)
                           * sizeof(char));
            if (VRes != NULL && VResName != NULL) {
                sprintf(VResName, "(%s) * (%s)", Q_GetName(Q), V_GetName(V));
                V_Constr(VRes, VResName, Dim, Tempor, True);
                
                /* sort of elements and allocation of diagonal elements
                   of the matrix Q */
                Q_SortEl(Q);
                Q_AllocInvDiagEl(Q);

                if (LASResult() == LASOK && Q->ElSorted) {
                    /* assignment of auxiliary lokal variables */
                    QLen = Q->Len;
                    QEl = Q->El;
                    QDiagEl = Q->DiagEl;
                    VCmp = V->Cmp;
                    VResCmp = VRes->Cmp;

                    /* initialisation of the vector VRes */
                    if (Q->Symmetry || Q->ElOrder == Clmws)
                        V_SetAllCmp(VRes, 0.0);

                    /* analysis of multipliers of the lower, diagonal and upper part
                       of the matrix Q and of the vector V */
                    MultiplDV = Q->MultiplD * V->Multipl;
                    MultiplUV = Q->MultiplU * V->Multipl;
                    MultiplLV = Q->MultiplL * V->Multipl;
                    MultiplDVIsZero = IsZero(MultiplDV);
                    MultiplUVIsZero = IsZero(MultiplUV);
                    MultiplLVIsZero = IsZero(MultiplLV);
                    MultiplDVIsOne = IsOne(MultiplDV);
                    MultiplUVIsOne = IsOne(MultiplUV);
                    MultiplLVIsOne = IsOne(MultiplLV);
                    if (!IsZero(MultiplDV) && IsOne(MultiplUV / MultiplDV)
                        && IsOne(MultiplLV / MultiplDV)) {
                        MultiplDULVEquals = True;
                    } else {
                        MultiplDULVEquals = False;
                    }

                    /* multiplication of the lower, diagonal and upper part
                       of the matrix Q by the vector V */
                    if (Q->Symmetry) {
                        if (MultiplDULVEquals) {
                            for (RoC = 1; RoC <= Dim; RoC++) {
                                Len = QLen[RoC];
                                PtrEl = QEl[RoC];
                                   Sum = 0.0;
                                if (!MultiplDVIsOne)
                                    Cmp = MultiplDV * VCmp[RoC];
                                else
                                       Cmp = VCmp[RoC];
                                for (ElCount = Len; ElCount > 0; ElCount--) {
                                    if ((*PtrEl).Pos != RoC) {
                                        VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * Cmp;
                                        Sum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                    }
                                    PtrEl++;
                                }
                                Sum += (*QDiagEl[RoC]).Val * VCmp[RoC];
                                if (MultiplDVIsOne)
                                    VResCmp[RoC] += Sum;
                                else
                                    VResCmp[RoC] += MultiplDV * Sum;
                                  }
                        } else {
                            for (RoC = 1; RoC <= Dim; RoC++) {
                                Len = QLen[RoC];
                                   Sum = 0.0;
                                if ((!MultiplUVIsZero && Q->ElOrder == Rowws)
                                    || (!MultiplLVIsZero && Q->ElOrder == Clmws)) {
                                    PtrEl = QEl[RoC];
                                        for (ElCount = Len; ElCount > 0; ElCount--) {
                                        if ((*PtrEl).Pos != RoC) {
                                            Sum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                        }
                                        PtrEl++;
                                    }
                                    if (!MultiplUVIsZero && !MultiplUVIsOne)
                                           Sum = MultiplUV * Sum;
                                    if (!MultiplLVIsZero && !MultiplLVIsOne)
                                           Sum = MultiplLV * Sum;
                                }
                                if (!MultiplDVIsZero) {
                                    if (MultiplDVIsOne) {
                                        Sum += (*QDiagEl[RoC]).Val * VCmp[RoC];
                                    }
                                    else { // changed
                                        Sum += MultiplDV * (*QDiagEl[RoC]).Val * VCmp[RoC];
                                    }
                                }
                                VResCmp[RoC] += Sum;
                                if ((!MultiplUVIsZero && Q->ElOrder == Clmws)
                                    || (!MultiplLVIsZero && Q->ElOrder == Rowws)) {
                                      Cmp = VCmp[RoC];
                                    if (!MultiplUVIsZero && !MultiplUVIsOne)
                                         Cmp *= MultiplUV;
                                    if (!MultiplLVIsZero && !MultiplLVIsOne)
                                             Cmp *= MultiplLV;
                                    PtrEl = QEl[RoC];
                                        for (ElCount = Len; ElCount > 0; ElCount--) {
                                        if ((*PtrEl).Pos != RoC)
                                             VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * Cmp;
                                        PtrEl++;
                                    }
                                }
                              }
                        }
                    }
                    if (!Q->Symmetry && Q->ElOrder == Rowws) {
                        if (MultiplDULVEquals) {
                            for (Row = 1; Row <= Dim; Row++) {
                                Len = QLen[Row];
                                PtrEl = QEl[Row];
                                    Sum = 0.0;
                                for (ElCount = Len; ElCount > 0; ElCount--) {
                                    Sum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                    PtrEl++;
                                }
                                if (MultiplDVIsOne)
                                    VResCmp[Row] = Sum;
                                else
                                    VResCmp[Row] = MultiplDV * Sum;
                              }
                          } else {
                            for (Row = 1; Row <= Dim; Row++) {
                                Len = QLen[Row];
                                Sum = 0.0;
                                if (!MultiplLVIsZero) {
                                    PtrEl = QEl[Row];
                                        PartSum = 0.0;
                                      for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos < Row;
                                        ElCount--) {
                                        PartSum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                        PtrEl++;
                                    }
                                    if (MultiplLVIsOne)
                                        Sum += PartSum;
                                    else
                                        Sum += MultiplLV * PartSum;
                                }
                                if (!MultiplDVIsZero) {
                                    if (MultiplDVIsOne)
                                        Sum += (*QDiagEl[Row]).Val * VCmp[Row];
                                    else
                                        Sum += MultiplDV * (*QDiagEl[Row]).Val * VCmp[Row];
                                }
                                if (!MultiplUVIsZero) {
                                    PtrEl = QEl[Row] + Len - 1;
                                        PartSum = 0.0;
                                      for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos > Row;
                                        ElCount--) {
                                        PartSum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                        PtrEl--;
                                    }
                                    if (MultiplUVIsOne)
                                        Sum += PartSum;
                                    else
                                        Sum += MultiplUV * PartSum;
                                }
                                VResCmp[Row] = Sum;
                              }
                        }
                    }
                    if (!Q->Symmetry && Q->ElOrder == Clmws) {
                        if (MultiplDULVEquals) {
                             for (Clm = 1; Clm <= Dim; Clm++) {
                                Len = QLen[Clm];
                                PtrEl = QEl[Clm];
                                if (MultiplDVIsOne)
                                       Cmp = VCmp[Clm];
                                else
                                    Cmp = MultiplDV * VCmp[Clm];
                                for (ElCount = Len; ElCount > 0; ElCount--) {
                                    VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * Cmp;
                                    PtrEl++;
                                }
                            }
                          } else {
                            for (Clm = 1; Clm <= Dim; Clm++) {
                                Len = QLen[Clm];
                                Cmp = VCmp[Clm];
                                if (!MultiplUVIsZero) {
                                    PtrEl = QEl[Clm];
                                    if (MultiplUVIsOne)
                                        PartCmp = Cmp;
                                    else
                                        PartCmp = MultiplUV * Cmp;
                                      for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos < Clm;
                                        ElCount--) {
                                         VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * PartCmp;
                                        PtrEl++;
                                    }
                                }
                                if (!MultiplDVIsZero) {
                                    if (MultiplDVIsOne)
                                         VResCmp[Clm] += (*QDiagEl[Clm]).Val * Cmp;
                                    else
                                         VResCmp[Clm] += MultiplDV * (*QDiagEl[Clm]).Val * Cmp;
                                }
                                if (!MultiplLVIsZero) {
                                    PtrEl = QEl[Clm] + Len - 1;
                                    if (MultiplLVIsOne)
                                        PartCmp = Cmp;
                                    else
                                        PartCmp = MultiplLV * Cmp;
                                      for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos > Clm;
                                        ElCount--) {
                                         VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * Cmp;
                                        PtrEl--;
                                    }
                                }
                              }
                        }
                    }
                } else {
                    if (LASResult() == LASOK && !(*Q->ElSorted))
                        LASError(LASElNotSortedErr, "Mul_QV", Q_GetName(Q), V_GetName(V), NULL);
                }
            } else {
                LASError(LASMemAllocErr, "Mul_QV", Q_GetName(Q), V_GetName(V), NULL);
                if (VRes != NULL)
                    free(VRes);
            }
            
            if (VResName != NULL)
                free(VResName);
        } else {
            LASError(LASDimErr, "Mul_QV", Q_GetName(Q), V_GetName(V), NULL);
            VRes = NULL;
        }
    } else {
        VRes = NULL;
    }

    Q_Unlock(Q);
    V_Unlock(V);

    return(VRes);
}